

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O2

word ppAddMulW(word *b,word *a,size_t n,word w,void *stack)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  word wVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  
  *(undefined8 *)stack = 0;
  *(word *)((long)stack + 8) = w;
  uVar3 = w * 2;
  *(ulong *)((long)stack + 0x10) = uVar3;
  uVar5 = uVar3 ^ w;
  *(ulong *)((long)stack + 0x18) = uVar5;
  uVar1 = w * 4;
  *(ulong *)((long)stack + 0x20) = uVar1;
  *(ulong *)((long)stack + 0x28) = uVar1 ^ w;
  *(ulong *)((long)stack + 0x30) = uVar5 * 2;
  uVar9 = uVar5 * 2 ^ w;
  *(ulong *)((long)stack + 0x38) = uVar9;
  uVar2 = w * 8;
  *(ulong *)((long)stack + 0x40) = uVar2;
  *(ulong *)((long)stack + 0x48) = uVar2 ^ w;
  uVar7 = (uVar1 ^ w) * 2;
  *(ulong *)((long)stack + 0x50) = uVar7;
  *(ulong *)((long)stack + 0x58) = uVar7 ^ w;
  *(ulong *)((long)stack + 0x60) = uVar5 << 2;
  *(ulong *)((long)stack + 0x68) = uVar5 << 2 ^ w;
  uVar9 = uVar9 * 2;
  *(ulong *)((long)stack + 0x70) = uVar9;
  *(ulong *)((long)stack + 0x78) = uVar9 ^ w;
  wVar6 = 0;
  for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
    uVar7 = *(long *)((long)stack + (a[sVar8] >> 0x3c) * 8) << 4 ^
            *(ulong *)((long)stack + (ulong)((byte)(a[sVar8] >> 0x38) & 0xf) * 8);
    *(ulong *)((long)stack + 0x80) = uVar7;
    *(ulong *)((long)stack + 0x88) = uVar7 >> 0x38;
    uVar9 = *(long *)((long)stack + (ulong)((uint)(a[sVar8] >> 0x34) & 0xf) * 8) << 4 ^ uVar7 << 8 ^
            *(ulong *)((long)stack + (ulong)((ushort)(a[sVar8] >> 0x30) & 0xf) * 8);
    *(ulong *)((long)stack + 0x80) = uVar9;
    uVar5 = (uVar7 >> 0x38) << 8 | uVar9 >> 0x38;
    *(ulong *)((long)stack + 0x88) = uVar5;
    uVar4 = (uint)(a[sVar8] >> 0x20);
    uVar7 = *(long *)((long)stack + (ulong)(uVar4 >> 0xc & 0xf) * 8) << 4 ^ uVar9 << 8 ^
            *(ulong *)((long)stack + (ulong)(uVar4 >> 8 & 0xf) * 8);
    *(ulong *)((long)stack + 0x80) = uVar7;
    uVar9 = uVar5 << 8 | uVar7 >> 0x38;
    *(ulong *)((long)stack + 0x88) = uVar9;
    uVar4 = (uint)(a[sVar8] >> 0x20);
    uVar7 = *(long *)((long)stack + (ulong)(uVar4 >> 4 & 0xf) * 8) << 4 ^ uVar7 << 8 ^
            *(ulong *)((long)stack + (ulong)(uVar4 & 0xf) * 8);
    *(ulong *)((long)stack + 0x80) = uVar7;
    uVar9 = uVar9 << 8 | uVar7 >> 0x38;
    *(ulong *)((long)stack + 0x88) = uVar9;
    uVar7 = *(long *)((long)stack + (ulong)((uint)a[sVar8] >> 0x1c) * 8) << 4 ^ uVar7 << 8 ^
            *(ulong *)((long)stack + (ulong)((uint)a[sVar8] >> 0x15 & 0x78));
    *(ulong *)((long)stack + 0x80) = uVar7;
    uVar9 = uVar9 << 8 | uVar7 >> 0x38;
    *(ulong *)((long)stack + 0x88) = uVar9;
    uVar7 = *(long *)((long)stack + (ulong)((uint)a[sVar8] >> 0x11 & 0x78)) << 4 ^ uVar7 << 8 ^
            *(ulong *)((long)stack + (ulong)((uint)a[sVar8] >> 0xd & 0x78));
    *(ulong *)((long)stack + 0x80) = uVar7;
    uVar9 = uVar9 << 8 | uVar7 >> 0x38;
    *(ulong *)((long)stack + 0x88) = uVar9;
    uVar7 = *(long *)((long)stack + (ulong)((uint)a[sVar8] >> 9 & 0x78)) << 4 ^ uVar7 << 8 ^
            *(ulong *)((long)stack + (ulong)((uint)a[sVar8] >> 5 & 0x78));
    *(ulong *)((long)stack + 0x80) = uVar7;
    uVar9 = uVar9 << 8 | uVar7 >> 0x38;
    *(ulong *)((long)stack + 0x88) = uVar9;
    uVar7 = *(long *)((long)stack + (ulong)((uint)a[sVar8] >> 1 & 0x78)) << 4 ^ uVar7 << 8 ^
            *(ulong *)((long)stack + (ulong)((uint)a[sVar8] & 0xf) * 8);
    *(ulong *)((long)stack + 0x80) = uVar7;
    uVar9 = a[sVar8] >> 1 & (long)w >> 0x3f & 0x7f7f7f7f7f7f7f7fU ^ uVar9;
    *(ulong *)((long)stack + 0x88) = uVar9;
    uVar9 = a[sVar8] >> 2 & (long)uVar3 >> 0x3f & 0x3f3f3f3f3f3f3f3fU ^ uVar9;
    *(ulong *)((long)stack + 0x88) = uVar9;
    uVar9 = a[sVar8] >> 3 & (long)uVar1 >> 0x3f & 0x1f1f1f1f1f1f1f1fU ^ uVar9;
    *(ulong *)((long)stack + 0x88) = uVar9;
    uVar9 = a[sVar8] >> 4 & (long)uVar2 >> 0x3f & 0xf0f0f0f0f0f0f0fU ^ uVar9;
    *(ulong *)((long)stack + 0x88) = uVar9;
    uVar9 = a[sVar8] >> 5 & (long)(w << 4) >> 0x3f & 0x707070707070707U ^ uVar9;
    *(ulong *)((long)stack + 0x88) = uVar9;
    uVar9 = a[sVar8] >> 6 & (long)(w << 5) >> 0x3f & 0x303030303030303U ^ uVar9;
    *(ulong *)((long)stack + 0x88) = uVar9;
    *(word *)((long)stack + 0x88) =
         a[sVar8] >> 7 & (long)(w << 6) >> 0x3f & 0x101010101010101U ^ uVar9;
    b[sVar8] = wVar6 ^ b[sVar8] ^ uVar7;
    wVar6 = *(word *)((long)stack + 0x88);
  }
  return wVar6;
}

Assistant:

word ppAddMulW(word b[], const word a[], size_t n, register word w, 
	void* stack)
{
	register word carry = 0;
	size_t i;
	word* t = (word*)stack;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	_MUL_PRE_S4(t, w);
	for (i = 0; i < n; ++i)
	{
		_MUL_MUL_S4(t[16], t[17], t, a[i]);
		_MUL_REPAIR_S4(t[17], w, a[i]);
		b[i] ^= carry ^ t[16];
		carry = t[17];
	}
	w = 0;
	return carry;
}